

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

void __thiscall GEO::Stopwatch::~Stopwatch(Stopwatch *this)

{
  pointer pcVar1;
  ostream *poVar2;
  clock_t cVar3;
  tms end;
  tms local_30;
  
  if (this->verbose_ == true) {
    poVar2 = Logger::out(&this->task_name_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Elapsed time: ",0xe);
    cVar3 = times(&local_30);
    poVar2 = std::ostream::_M_insert<double>((double)(cVar3 - (this->W_).start_user_) / 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," s",2);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pcVar1 = (this->task_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->task_name_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Stopwatch() {
	    if(verbose_) {
		Logger::out(task_name_)
		    << "Elapsed time: " << W_.elapsed_user_time()
		    << " s" << std::endl;
	    }
        }